

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamer.cpp
# Opt level: O2

void __thiscall streamer::Streamer::~Streamer(Streamer *this)

{
  EVP_PKEY_CTX *in_RSI;
  
  cleanup(this,in_RSI);
  avformat_network_deinit();
  StreamerConfig::~StreamerConfig(&this->config);
  Picture::~Picture(&this->picture);
  Scaler::~Scaler(&this->scaler);
  return;
}

Assistant:

Streamer::~Streamer()
{
    cleanup();
    avformat_network_deinit();
}